

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

KindedSources * __thiscall
cmGeneratorTarget::GetKindedSources(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  KindedSources *files;
  undefined1 local_210 [16];
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  _Self local_68 [3];
  _Self local_50;
  iterator it;
  string key;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  if ((this->LinkImplementationLanguageIsContextDependent & 1U) == 0) {
    key.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
         ::begin(&this->KindedSourcesMap);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>
                           *)((long)&key.field_2 + 8));
    this_local = (cmGeneratorTarget *)&ppVar3->second;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&it,config);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
         ::find(&this->KindedSourcesMap,(string *)&it);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
         ::end(&this->KindedSourcesMap);
    bVar1 = std::operator!=(&local_50,local_68);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>
               ::operator->(&local_50);
      if (((ppVar3->second).Initialized & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        poVar4 = std::operator<<((ostream *)local_1e0,"The SOURCES of \"");
        psVar5 = GetName_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,
                        "\" use a generator expression that depends on the SOURCES themselves.");
        this_00 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
        std::__cxx11::ostringstream::str();
        GetBacktrace((cmGeneratorTarget *)local_210);
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_210 + 0x10),
                            (cmListFileBacktrace *)local_210);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_210);
        std::__cxx11::string::~string((string *)(local_210 + 0x10));
        if (GetKindedSources(std::__cxx11::string_const&)::empty == '\0') {
          iVar2 = __cxa_guard_acquire(&GetKindedSources(std::__cxx11::string_const&)::empty);
          if (iVar2 != 0) {
            KindedSources::KindedSources(&GetKindedSources::empty);
            __cxa_atexit(KindedSources::~KindedSources,&GetKindedSources::empty,&__dso_handle);
            __cxa_guard_release(&GetKindedSources(std::__cxx11::string_const&)::empty);
          }
        }
        this_local = (cmGeneratorTarget *)&GetKindedSources::empty;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      }
      else {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>
                 ::operator->(&local_50);
        this_local = (cmGeneratorTarget *)&ppVar3->second;
      }
    }
    else {
      this_local = (cmGeneratorTarget *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
                   ::operator[](&this->KindedSourcesMap,(key_type *)&it);
      ComputeKindedSources(this,(KindedSources *)this_local,config);
      *(undefined1 *)
       &(this_local->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 1;
    }
    std::__cxx11::string::~string((string *)&it);
  }
  return (KindedSources *)this_local;
}

Assistant:

cmGeneratorTarget::KindedSources const& cmGeneratorTarget::GetKindedSources(
  std::string const& config) const
{
  // If we already processed one configuration and found no dependenc
  // on configuration then always use the one result.
  if (!this->LinkImplementationLanguageIsContextDependent) {
    return this->KindedSourcesMap.begin()->second;
  }

  // Lookup any existing link implementation for this configuration.
  std::string const key = cmSystemTools::UpperCase(config);
  KindedSourcesMapType::iterator it = this->KindedSourcesMap.find(key);
  if (it != this->KindedSourcesMap.end()) {
    if (!it->second.Initialized) {
      std::ostringstream e;
      e << "The SOURCES of \"" << this->GetName()
        << "\" use a generator expression that depends on the "
           "SOURCES themselves.";
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
      static KindedSources empty;
      return empty;
    }
    return it->second;
  }

  // Add an entry to the map for this configuration.
  KindedSources& files = this->KindedSourcesMap[key];
  this->ComputeKindedSources(files, config);
  files.Initialized = true;
  return files;
}